

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O2

bool __thiscall
ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>::Pop
          (ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
           *this,pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *out)

{
  type __p;
  type ppVar1;
  int64 iVar2;
  
  std::mutex::lock(&this->mtx);
  __p = (this->
        super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
        ).c.
        super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar1 = (this->
           super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
           ).c.
           super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar1 != __p) {
    std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::operator=(out,__p);
    std::
    deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
    ::pop_front((deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                 *)this);
    cv::TickMeter::stop(&this->tm);
    iVar2 = cv::getTickCount();
    (this->tm).startTime = iVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return ppVar1 != __p;
}

Assistant:

bool Pop(T& out) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! if the queue is empty, just exit
    if (this->empty()) {
      return false;
    }
    //! get the first element, and remove it
    out = this->front();
    this->pop();
    //! stop the current timer
    tm.stop();
    //! start the next timer
    tm.start();
    //! return true, indicating successful pop
    return true;
  }